

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O3

void __thiscall indk::Interlink::doInitOutput(Interlink *this)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  Client *this_00;
  ulong *puVar6;
  size_type *psVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  iVar3 = System::getVerbosityLevel();
  if (0 < iVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Incoming Interlink connection from ",0x23);
    pcVar1 = (this->Host)._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + (this->Host)._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_90,(ulong)(this->OutputPort)._M_dataplus._M_p);
    puVar6 = (ulong *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar6) {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0.field_2._8_8_ = plVar4[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar6;
      local_b0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_b0._M_string_length = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  this_00 = (Client *)operator_new(8);
  pcVar1 = (this->Host)._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + (this->Host)._M_string_length);
  std::__cxx11::string::append((char *)local_70);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_70,(ulong)(this->OutputPort)._M_dataplus._M_p);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar7;
    local_50._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  httplib::Client::Client(this_00,&local_50,&local_b0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  this->Output = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  lVar2 = *this->Output;
  *(undefined8 *)(lVar2 + 0x170) = 5;
  *(undefined8 *)(lVar2 + 0x178) = 0;
  *(undefined8 *)(lVar2 + 0x180) = 5;
  *(undefined8 *)(lVar2 + 0x188) = 0;
  *(undefined8 *)(lVar2 + 0x160) = 0;
  *(undefined8 *)(lVar2 + 0x168) = 500000;
  LOCK();
  (this->Interlinked)._M_base._M_i = true;
  UNLOCK();
  return;
}

Assistant:

void indk::Interlink::doInitOutput() {
    if (indk::System::getVerbosityLevel() > 0)
        std::cout << "Incoming Interlink connection from " << Host+":"+OutputPort << std::endl;
    Output = new httplib::Client(Host+":"+OutputPort);
    auto output = (httplib::Client*)Output;
    output -> set_read_timeout(5, 0);
    output -> set_write_timeout(5, 0);
    output -> set_connection_timeout(0, 500000);
    Interlinked.store(true);
}